

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

string * deqp::gles31::Functional::anon_unknown_1::getUniformName
                   (string *__return_storage_ptr__,string *name,int declNdx,int arrNdx)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  long *local_240;
  undefined8 local_238;
  long local_230;
  undefined8 uStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::operator<<(local_1a0,declNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)local_1c0,0,(char *)0x0,(ulong)(name->_M_dataplus)._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1d0 = *plVar4;
    lStack_1c8 = plVar2[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *plVar4;
    local_1e0 = (long *)*plVar2;
  }
  local_1d8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_210 = *puVar5;
    lStack_208 = plVar2[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar5;
    local_220 = (ulong *)*plVar2;
  }
  local_218 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::operator<<(local_1a0,arrNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  uVar7 = 0xf;
  if (local_220 != &local_210) {
    uVar7 = local_210;
  }
  if (uVar7 < (ulong)(local_1f8 + local_218)) {
    uVar7 = 0xf;
    if (local_200 != local_1f0) {
      uVar7 = local_1f0[0];
    }
    if ((ulong)(local_1f8 + local_218) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_220);
      goto LAB_01481385;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_200);
LAB_01481385:
  local_240 = &local_230;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_230 = *plVar2;
    uStack_228 = puVar3[3];
  }
  else {
    local_230 = *plVar2;
    local_240 = (long *)*puVar3;
  }
  local_238 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_240);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getUniformName (const std::string& name, int declNdx, int arrNdx)
{
	return name + de::toString(declNdx) + "[" + de::toString(arrNdx) + "]";
}